

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O3

bool find_str_and_remove(char *s,char *target)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char cVar11;
  int iVar12;
  bool bVar13;
  
  sVar2 = strlen(target);
  sVar3 = strlen(s);
  if ((int)sVar3 < 1) {
    bVar13 = false;
  }
  else {
    uVar5 = sVar3 & 0x7fffffff;
    bVar13 = true;
    uVar7 = 0;
    iVar12 = (int)sVar2;
    uVar8 = sVar2 & 0xffffffff;
    pcVar9 = s;
    do {
      if (0 < iVar12) {
        uVar10 = 0;
        do {
          cVar6 = pcVar9[uVar10];
          cVar1 = target[uVar10];
          if (cVar6 != cVar1) {
            cVar11 = cVar6 + -0x20;
            if (0x19 < (byte)(cVar6 + 0x9fU)) {
              cVar11 = cVar6;
            }
            cVar6 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar6 = cVar1;
            }
            if (cVar11 != cVar6) goto LAB_001a07bc;
          }
          uVar10 = uVar10 + 1;
        } while ((sVar2 & 0x7fffffff) != uVar10);
        if (0 < iVar12) {
          if ((int)sVar3 < (int)uVar7 + iVar12) {
            return bVar13;
          }
          lVar4 = (long)(int)uVar8 + -1;
          do {
            s[uVar7] = s[lVar4 + 1];
            uVar7 = uVar7 + 1;
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)uVar5);
          return bVar13;
        }
      }
LAB_001a07bc:
      uVar7 = uVar7 + 1;
      bVar13 = uVar7 < uVar5;
      uVar8 = (ulong)((int)uVar8 + 1);
      pcVar9 = pcVar9 + 1;
    } while (uVar7 != uVar5);
  }
  return bVar13;
}

Assistant:

bool
find_str_and_remove(char *s, const char *target)
{
  // uses a dumb algorithm
  int start, i, j;
  int len = strlen(target);
  int tot_len = strlen(s);
  bool matches = false;
  for (i = 0; i < tot_len; i++) {
    start = i;
    for (j = 0; j < len; j++) {
      if (case_compare(s[i + j], target[j]))
        matches = true;
      else {
        matches = false;
        break;
      }
    }
    if (matches) {
      for (i = start, j = start + len; j <= tot_len; i++, j++)
        // use <= on j so also copies the zero at the end
        s[i] = s[j];
      return true;
    }
  }
  // if get to here, then no match
  return false;
}